

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

json * nanojson3::json::json_reader<const_char_*>::read_json
                 (json *__return_storage_ptr__,char *begin,char *end,json_parse_option loose_option)

{
  undefined1 auStack_58 [72];
  
  json_reader((json_reader<const_char_*> *)auStack_58,begin,end,loose_option);
  execute(__return_storage_ptr__,(json_reader<const_char_*> *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

static json read_json(CharInputIterator begin, CharInputIterator end, json_parse_option loose_option)
        {
            return json_reader(begin, end, loose_option).execute();
        }